

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_AdderTree(FILE *pFile,int nArgs,int nBits)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  
  uVar7 = nBits;
  if (1 < (uint)nBits) {
    uVar7 = 0;
    uVar5 = nBits - 1;
    do {
      uVar7 = uVar7 + 1;
      bVar10 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar10);
  }
  uVar2 = nArgs - 1;
  uVar5 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  iVar3 = (uVar5 ^ 0xffffffe0) + 0x21;
  if ((uint)nArgs < 2) {
    iVar3 = nArgs;
  }
  if ((1 < nArgs) && (1 < nBits)) {
    fprintf((FILE *)pFile,"module adder_tree_%d_%d (\n   ",(ulong)(uint)nArgs,(ulong)(uint)nBits);
    uVar5 = 0;
    do {
      uVar6 = 0;
      do {
        fprintf((FILE *)pFile," i%0*d_%0*d,",(ulong)uVar7,uVar6,(ulong)uVar7,(ulong)(~uVar5 + nBits)
               );
        uVar8 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar8;
      } while (nArgs != uVar8);
      uVar5 = uVar5 + 1;
      fwrite("\n   ",4,1,(FILE *)pFile);
    } while (uVar5 != nBits);
    fwrite(" z\n",3,1,(FILE *)pFile);
    fwrite("  );\n",5,1,(FILE *)pFile);
    uVar5 = 0;
    do {
      fwrite("  input",7,1,(FILE *)pFile);
      uVar8 = 0;
      do {
        pcVar4 = ",";
        if (uVar2 == uVar8) {
          pcVar4 = "";
        }
        fprintf((FILE *)pFile," i%0*d_%0*d%s",(ulong)uVar7,(ulong)uVar8,(ulong)uVar7,
                (ulong)(~uVar5 + nBits),pcVar4);
        uVar8 = uVar8 + 1;
      } while (nArgs != uVar8);
      fwrite(";\n",2,1,(FILE *)pFile);
      uVar5 = uVar5 + 1;
    } while (uVar5 != nBits);
    fprintf((FILE *)pFile,"  output [%d:0] z;\n");
    uVar5 = 0;
    do {
      fprintf((FILE *)pFile,"  wire [%d:0] t%d = {",(ulong)(nBits - 1),(ulong)uVar5);
      uVar6 = (ulong)(nBits - 1);
      do {
        uVar8 = (int)uVar6 - 1;
        pcVar4 = ",";
        if ((int)uVar6 == 0) {
          pcVar4 = "";
        }
        fprintf((FILE *)pFile," i%0*d_%0*d%s",(ulong)uVar7,(ulong)uVar5,(ulong)uVar7,uVar6,pcVar4);
        uVar6 = (ulong)uVar8;
      } while (uVar8 != 0xffffffff);
      fwrite(" };\n",4,1,(FILE *)pFile);
      uVar5 = uVar5 + 1;
    } while (uVar5 != nArgs);
    if (0 < (int)uVar2) {
      iVar9 = 0;
      uVar7 = 0;
      do {
        uVar5 = uVar7 + 1;
        bVar10 = iVar9 == 0;
        iVar9 = iVar9 + -1;
        pcVar1 = "cQ b(N b+N D(bN c+N N.b( +8bN bD(N. +8cN bQ( b+Q b(QD cQ+ Qjb( +Qb8 bQDj( s";
        if (bVar10) {
          pcVar1 = "v+ 4Dvk v6gU 7vU v>7U vU7H gU7v 6UvM v6U+Q Vv6 g6Vv 7Ulv 7vUl> 7Vv y7V t6 t";
        }
        pcVar4 = (char *)CONCAT44((int)((ulong)pcVar4 >> 0x20),uVar7);
        fprintf((FILE *)pFile,"  wire [%d:0] s%d = t%d + %s%d;\n",(ulong)((nBits + iVar3) - 1),
                (ulong)uVar5,(ulong)uVar5,pcVar1 + 0x4a,pcVar4);
        uVar7 = uVar5;
      } while (uVar5 != uVar2);
    }
    fprintf((FILE *)pFile,"  assign z = s%d;\n");
    fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
    return;
  }
  __assert_fail("nArgs > 1 && nBits > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                ,0x347,"void Abc_AdderTree(FILE *, int, int)");
}

Assistant:

void Abc_AdderTree( FILE * pFile, int nArgs, int nBits )
{
    int i, k, nDigits = Abc_Base10Log( nBits ), Log2 = Abc_Base2Log( nArgs );
    assert( nArgs > 1 && nBits > 1 );
    fprintf( pFile, "module adder_tree_%d_%d (\n   ", nArgs, nBits );
    for ( i = 0; i < nBits; i++, fprintf(pFile, "\n   ") )
        for ( k = 0; k < nArgs; k++ )
            fprintf( pFile, " i%0*d_%0*d,", nDigits, k, nDigits, nBits-1-i );
    fprintf( pFile, " z\n" );
    fprintf( pFile, "  );\n" );
    for ( i = 0; i < nBits; i++ )
    {
        fprintf( pFile, "  input" );
        for ( k = 0; k < nArgs; k++ )
            fprintf( pFile, " i%0*d_%0*d%s", nDigits, k, nDigits, nBits-1-i, k==nArgs-1 ? "":"," );
        fprintf( pFile, ";\n" );
    }
    fprintf( pFile, "  output [%d:0] z;\n", nBits+Log2-1 );
    for ( i = 0; i < nArgs; i++ )
    {
        fprintf( pFile, "  wire [%d:0] t%d = {", nBits-1, i );
        for ( k = 0; k < nBits; k++ )
            fprintf( pFile, " i%0*d_%0*d%s", nDigits, i, nDigits, nBits-1-k, k==nBits-1 ? "":"," );
        fprintf( pFile, " };\n" );
    }
    for ( i = 0; i < nArgs-1; i++ )
        fprintf( pFile, "  wire [%d:0] s%d = t%d + %s%d;\n", nBits+Log2-1, i+1, i+1, i ? "s":"t", i );
    fprintf( pFile, "  assign z = s%d;\n", nArgs-1 );
    fprintf( pFile, "endmodule\n\n" ); 
}